

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

bool __thiscall Network::createQualModel(Network *this)

{
  bool bVar1;
  QualModel *pQVar2;
  SystemError *this_00;
  undefined1 local_68 [48];
  Network *local_18;
  Network *this_local;
  
  local_18 = this;
  if ((this->qualModel != (QualModel *)0x0) && (this->qualModel != (QualModel *)0x0)) {
    (*this->qualModel->_vptr_QualModel[1])();
  }
  option_abi_cxx11_((Network *)&stack0xffffffffffffffc8,(StringOption)this);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &stack0xffffffffffffffc8,"NONE");
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  if (bVar1) {
    this->qualModel = (QualModel *)0x0;
  }
  else {
    option_abi_cxx11_((Network *)local_68,(StringOption)this);
    pQVar2 = QualModel::factory((string *)local_68);
    this->qualModel = pQVar2;
    std::__cxx11::string::~string((string *)local_68);
    if (this->qualModel == (QualModel *)0x0) {
      this_00 = (SystemError *)__cxa_allocate_exception(0x30);
      SystemError::SystemError(this_00,5);
      __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
    }
  }
  return true;
}

Assistant:

bool Network::createQualModel()
{
    if ( qualModel ) delete qualModel;
    if (option(Options::QUAL_MODEL) == "NONE")
    {
        qualModel = nullptr;
        return true;
    }
    qualModel = QualModel::factory(option(Options::QUAL_MODEL));
    if ( qualModel == nullptr )
    {
        throw SystemError(SystemError::QUALITY_MODEL_NOT_OPENED);
    }
	return true;
}